

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

Path * __thiscall Pathie::Path::absolute(Path *__return_storage_ptr__,Path *this,Path *base)

{
  string sStack_58;
  string local_38;
  
  if (*(this->m_path)._M_dataplus._M_p == '/') {
    std::__cxx11::string::string((string *)&local_38,(string *)this);
    Path(__return_storage_ptr__,&local_38);
  }
  else {
    std::__cxx11::string::string((string *)&sStack_58,(string *)this);
    join(__return_storage_ptr__,base,&sStack_58);
  }
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

Path Path::absolute(const Path& base /* = Path::pwd() */) const
{
  if (is_absolute())
    return Path(m_path);
  else
    return base.join(m_path);
}